

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall
glslang::TParseContext::inheritMemoryQualifiers(TParseContext *this,TQualifier *from,TQualifier *to)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)&from->field_0x8;
  if ((uVar1 >> 0x2f & 1) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x800000000000;
    uVar1 = *(ulong *)&from->field_0x8;
  }
  if ((uVar1 >> 0x30 & 1) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x1000000000000;
    uVar1 = *(ulong *)&from->field_0x8;
  }
  if ((uVar1 >> 0x31 & 1) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x2000000000000;
    uVar1 = *(ulong *)&from->field_0x8;
  }
  if ((uVar1 >> 0x32 & 1) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x4000000000000;
    uVar1 = *(ulong *)&from->field_0x8;
  }
  if ((uVar1 >> 0x33 & 1) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x8000000000000;
    uVar1 = *(ulong *)&from->field_0x8;
  }
  if ((uVar1 >> 0x2e & 1) != 0) {
    *(ulong *)&to->field_0x8 = *(ulong *)&to->field_0x8 | 0x400000000000;
  }
  return;
}

Assistant:

bool isReadOnly() const { return readonly; }